

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::EnumGenerator
          (EnumGenerator *this,EnumDescriptor *descriptor,Options *options)

{
  int iVar1;
  int iVar2;
  bool in_CL;
  ulong uVar3;
  ulong uVar4;
  
  this->descriptor_ = descriptor;
  uVar4 = 0;
  ClassName_abi_cxx11_(&this->classname_,(cpp *)descriptor,(EnumDescriptor *)0x0,in_CL);
  this->options_ = options;
  iVar2 = *(int *)(*(long *)(descriptor + 0x30) + 0x10);
  uVar3 = (ulong)*(uint *)(descriptor + 0x2c);
  if ((int)*(uint *)(descriptor + 0x2c) < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 0x28 - uVar4 != 0; uVar4 = uVar4 + 0x28) {
    iVar1 = *(int *)(*(long *)(descriptor + 0x30) + 0x10 + uVar4);
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
  }
  this->generate_array_size_ = iVar2 != 0x7fffffff;
  return;
}

Assistant:

EnumGenerator::EnumGenerator(const EnumDescriptor* descriptor,
                             const Options& options)
  : descriptor_(descriptor),
    classname_(ClassName(descriptor, false)),
    options_(options),
    generate_array_size_(ShouldGenerateArraySize(descriptor)) {
}